

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.cpp
# Opt level: O2

void __thiscall duckdb::Event::AddDependency(Event *this,Event *event)

{
  __shared_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2> _Stack_38;
  __weak_ptr<duckdb::Event,(__gnu_cxx::_Lock_policy)2> local_28 [8];
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_20;
  
  this->total_dependencies = this->total_dependencies + 1;
  enable_shared_from_this<duckdb::Event>::shared_from_this
            ((enable_shared_from_this<duckdb::Event> *)&_Stack_38);
  ::std::__weak_ptr<duckdb::Event,(__gnu_cxx::_Lock_policy)2>::__weak_ptr<duckdb::Event,void>
            (local_28,&_Stack_38);
  ::std::
  vector<duckdb::weak_ptr<duckdb::Event,true>,std::allocator<duckdb::weak_ptr<duckdb::Event,true>>>
  ::emplace_back<duckdb::weak_ptr<duckdb::Event,true>>
            ((vector<duckdb::weak_ptr<duckdb::Event,true>,std::allocator<duckdb::weak_ptr<duckdb::Event,true>>>
              *)&event->parents,(weak_ptr<duckdb::Event,_true> *)local_28);
  ::std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count(&local_20);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_38._M_refcount);
  return;
}

Assistant:

void Event::AddDependency(Event &event) {
	total_dependencies++;
	event.parents.push_back(weak_ptr<Event>(shared_from_this()));
#ifdef DEBUG
	event.parents_raw.push_back(*this);
#endif
}